

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctred.c
# Opt level: O1

void jpeg_idct_2x2(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  JSAMPLE *pJVar1;
  void *pvVar2;
  long lVar3;
  JSAMPLE JVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int aiStack_68 [8];
  int workspace [16];
  
  pJVar1 = cinfo->sample_range_limit;
  pvVar2 = compptr->dct_table;
  lVar3 = 0;
  uVar5 = 9;
  do {
    uVar6 = uVar5 - 1;
    if ((uVar5 != 3) && ((uVar6 & 0x7ffffffd) != 4)) {
      lVar10 = (long)*(short *)((long)coef_block + lVar3 + 0x10);
      if ((lVar10 == 0) &&
         (((*(short *)((long)coef_block + lVar3 + 0x30) == 0 &&
           (*(short *)((long)coef_block + lVar3 + 0x50) == 0)) &&
          (*(short *)((long)coef_block + lVar3 + 0x70) == 0)))) {
        iVar8 = (int)*(short *)((long)pvVar2 + lVar3) * (int)*(short *)((long)coef_block + lVar3) *
                4;
        *(int *)((long)aiStack_68 + lVar3 * 2) = iVar8;
      }
      else {
        uVar9 = (long)*(short *)((long)pvVar2 + lVar3) * (long)*(short *)((long)coef_block + lVar3)
                * 0x8000;
        lVar10 = lVar10 * *(short *)((long)pvVar2 + lVar3 + 0x10) * 0x73fc +
                 (long)*(short *)((long)pvVar2 + lVar3 + 0x30) *
                 (long)*(short *)((long)coef_block + lVar3 + 0x30) * -0x28ba +
                 (long)*(short *)((long)pvVar2 + lVar3 + 0x50) *
                 (long)*(short *)((long)coef_block + lVar3 + 0x50) * 0x1b37 +
                 (long)*(short *)((long)pvVar2 + lVar3 + 0x70) *
                 (long)*(short *)((long)coef_block + lVar3 + 0x70) * -0x1712;
        *(int *)((long)aiStack_68 + lVar3 * 2) = (int)(uVar9 + lVar10 + 0x1000 >> 0xd);
        iVar8 = (int)((uVar9 | 0x1000) - lVar10 >> 0xd);
      }
      *(int *)((long)workspace + lVar3 * 2) = iVar8;
    }
    lVar3 = lVar3 + 2;
    uVar5 = uVar6;
  } while (1 < uVar6);
  uVar9 = (ulong)output_col;
  lVar3 = 0;
  do {
    lVar10 = *(long *)((long)output_buf + lVar3);
    if (((aiStack_68[lVar3 + 1] == 0) && (aiStack_68[lVar3 + 3] == 0)) &&
       ((aiStack_68[lVar3 + 5] == 0 && (workspace[lVar3 + -1] == 0)))) {
      JVar4 = pJVar1[(ulong)(aiStack_68[lVar3] + 0x10U >> 5 & 0x3ff) + 0x80];
      *(JSAMPLE *)(lVar10 + uVar9) = JVar4;
    }
    else {
      iVar8 = aiStack_68[lVar3];
      iVar7 = aiStack_68[lVar3 + 1] * 0x73fc + workspace[lVar3 + -1] * -0x1712 +
              aiStack_68[lVar3 + 3] * -0x28ba + aiStack_68[lVar3 + 5] * 0x1b37;
      *(JSAMPLE *)(lVar10 + uVar9) =
           pJVar1[(ulong)(iVar8 * 0x8000 + iVar7 + 0x80000U >> 0x14 & 0x3ff) + 0x80];
      JVar4 = pJVar1[(ulong)((uint)((iVar8 * 0x8000 + 0x80000) - iVar7) >> 0x14 & 0x3ff) + 0x80];
    }
    *(JSAMPLE *)(lVar10 + 1 + uVar9) = JVar4;
    lVar3 = lVar3 + 8;
  } while (lVar3 == 8);
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_2x2(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JCOEFPTR coef_block, JSAMPARRAY output_buf,
              JDIMENSION output_col)
{
  JLONG tmp0, tmp10, z1;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE * 2];   /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; inptr++, quantptr++, wsptr++, ctr--) {
    /* Don't bother to process columns 2,4,6 */
    if (ctr == DCTSIZE - 2 || ctr == DCTSIZE - 4 || ctr == DCTSIZE - 6)
      continue;
    if (inptr[DCTSIZE * 1] == 0 && inptr[DCTSIZE * 3] == 0 &&
        inptr[DCTSIZE * 5] == 0 && inptr[DCTSIZE * 7] == 0) {
      /* AC terms all zero; we need not examine terms 2,4,6 for 2x2 output */
      int dcval = LEFT_SHIFT(DEQUANTIZE(inptr[DCTSIZE * 0],
                             quantptr[DCTSIZE * 0]), PASS1_BITS);

      wsptr[DCTSIZE * 0] = dcval;
      wsptr[DCTSIZE * 1] = dcval;

      continue;
    }

    /* Even part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp10 = LEFT_SHIFT(z1, CONST_BITS + 2);

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);
    tmp0 = MULTIPLY(z1, -FIX_0_720959822);  /* sqrt(2) * ( c7-c5+c3-c1) */
    z1 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    tmp0 += MULTIPLY(z1, FIX_0_850430095);  /* sqrt(2) * (-c1+c3+c5+c7) */
    z1 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    tmp0 += MULTIPLY(z1, -FIX_1_272758580); /* sqrt(2) * (-c1+c3-c5-c7) */
    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    tmp0 += MULTIPLY(z1, FIX_3_624509785);  /* sqrt(2) * ( c1+c3+c5+c7) */

    /* Final output stage */

    wsptr[DCTSIZE * 0] =
      (int)DESCALE(tmp10 + tmp0, CONST_BITS - PASS1_BITS + 2);
    wsptr[DCTSIZE * 1] =
      (int)DESCALE(tmp10 - tmp0, CONST_BITS - PASS1_BITS + 2);
  }

  /* Pass 2: process 2 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 2; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* It's not clear whether a zero row test is worthwhile here ... */

#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[3] == 0 && wsptr[5] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval = range_limit[(int)DESCALE((JLONG)wsptr[0],
                                               PASS1_BITS + 3) & RANGE_MASK];

      outptr[0] = dcval;
      outptr[1] = dcval;

      wsptr += DCTSIZE;         /* advance pointer to next row */
      continue;
    }
#endif

    /* Even part */

    tmp10 = LEFT_SHIFT((JLONG)wsptr[0], CONST_BITS + 2);

    /* Odd part */

    tmp0 = MULTIPLY((JLONG)wsptr[7], -FIX_0_720959822) + /* sqrt(2) * ( c7-c5+c3-c1) */
           MULTIPLY((JLONG)wsptr[5],  FIX_0_850430095) + /* sqrt(2) * (-c1+c3+c5+c7) */
           MULTIPLY((JLONG)wsptr[3], -FIX_1_272758580) + /* sqrt(2) * (-c1+c3-c5-c7) */
           MULTIPLY((JLONG)wsptr[1],  FIX_3_624509785);  /* sqrt(2) * ( c1+c3+c5+c7) */

    /* Final output stage */

    outptr[0] = range_limit[(int)DESCALE(tmp10 + tmp0,
                                         CONST_BITS + PASS1_BITS + 3 + 2) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)DESCALE(tmp10 - tmp0,
                                         CONST_BITS + PASS1_BITS + 3 + 2) &
                            RANGE_MASK];

    wsptr += DCTSIZE;           /* advance pointer to next row */
  }
}